

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintDebugDataRTI(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  double dVar4;
  double bits2uS;
  allocator<char> local_49;
  string local_48;
  quadlet_t *local_28;
  DebugData *p;
  double clockPeriod_local;
  quadlet_t *data_local;
  ostream *debugStream_local;
  
  local_28 = data;
  p = (DebugData *)clockPeriod;
  clockPeriod_local = (double)data;
  data_local = (quadlet_t *)debugStream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"PrintDebugDataRTI",&local_49);
  bVar1 = CheckDebugHeader(debugStream,&local_48,(char *)local_28,3);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::operator<<((ostream *)data_local,"*** RTI: ");
    if ((*(byte *)((long)local_28 + 7) & 0x80) != 0) {
      std::operator<<((ostream *)data_local,"sendBusy ");
    }
    if ((*(byte *)((long)local_28 + 7) & 0x40) != 0) {
      std::operator<<((ostream *)data_local,"sendRequest ");
    }
    if ((*(byte *)((long)local_28 + 7) & 8) != 0) {
      std::operator<<((ostream *)data_local,"responseRequired ");
    }
    if ((*(byte *)((long)local_28 + 7) & 4) != 0) {
      std::operator<<((ostream *)data_local,"recvNotReady ");
    }
    if ((*(byte *)((long)local_28 + 7) & 2) != 0) {
      std::operator<<((ostream *)data_local,"recvReady ");
    }
    if ((*(byte *)((long)local_28 + 7) & 1) != 0) {
      std::operator<<((ostream *)data_local,"PortReady ");
    }
    poVar2 = (ostream *)std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"rxState: ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,(ushort)((int)(*(byte *)((long)local_28 + 7) & 0x30) >> 4));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numPacketRecv: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*(byte *)((long)local_28 + 6));
    poVar2 = std::operator<<(poVar2,", numBytesRecv: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(ushort)local_28[1]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"numPacketSent: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(ushort)(byte)local_28[2]);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"txState: ");
    std::ostream::operator<<(poVar2,*(byte *)((long)local_28 + 9) & 7);
    if ((*(byte *)((long)local_28 + 9) & 0x10) != 0) {
      std::operator<<((ostream *)data_local,", txStateError ");
    }
    poVar2 = (ostream *)std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"respBytes: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,*(ushort *)((long)local_28 + 10));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    dVar4 = (double)p * 1000000.0;
    poVar2 = std::operator<<((ostream *)data_local,"timeReceive: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(ushort)local_28[3] * (double)p);
    poVar2 = std::operator<<(poVar2," timeSend: ");
    pvVar3 = (void *)std::ostream::operator<<
                               (poVar2,(double)*(ushort *)((long)local_28 + 0xe) * (double)p);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)data_local,"bw_wait: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,*(ushort *)((long)local_28 + 0x12));
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(double)*(ushort *)((long)local_28 + 0x12) * dVar4);
    poVar2 = std::operator<<(poVar2," us)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugDataRTI(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthRtInterface.v
    struct DebugData {
        char      header[4];        // Quad 0
        uint16_t  recv_nbytes;      // Quad 1
        uint8_t   numRecv;
        uint8_t   statusbits;
        uint8_t   numSent;          // Quad 2
        uint8_t   txStateBits;
        uint16_t  respBytes;
        uint16_t  timeReceive;      // Quad 3
        uint16_t  timeSend;
        uint16_t  quad4_low;        // Quad 4
        uint16_t  bw_wait;
        uint32_t  unused[3];        // Quad 5-7
    };
    if (sizeof(DebugData) != 8*sizeof(quadlet_t)) {
        debugStream << "PrintDebugDataRTI: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugDataRTI", p->header, 3))
        return;

    debugStream << "*** RTI: ";
    if (p->statusbits & 0x80) debugStream << "sendBusy ";
    if (p->statusbits & 0x40) debugStream << "sendRequest ";
    if (p->statusbits & 0x08) debugStream << "responseRequired ";
    if (p->statusbits & 0x04) debugStream << "recvNotReady ";
    if (p->statusbits & 0x02) debugStream << "recvReady ";
    if (p->statusbits & 0x01) debugStream << "PortReady ";
    debugStream << std::endl << "rxState: " << static_cast<uint16_t>((p->statusbits&0x30)>>4) << std::endl;
    debugStream << "numPacketRecv: " << static_cast<uint16_t>(p->numRecv)
                << ", numBytesRecv: " << p->recv_nbytes << std::endl;
    debugStream << "numPacketSent: " << static_cast<uint16_t>(p->numSent) << std::endl;
    debugStream << "txState: " << static_cast<uint16_t>(p->txStateBits&0x07);
    if (p->txStateBits&0x10) debugStream << ", txStateError ";
    debugStream << std::endl << "respBytes: " << p->respBytes << std::endl;
    const double bits2uS = clockPeriod*1e6;
    debugStream << "timeReceive: " << (p->timeReceive*clockPeriod) << " timeSend: " << (p->timeSend*clockPeriod) << std::endl;
    debugStream << "bw_wait: " << std::dec << p->bw_wait << " (" << p->bw_wait*bits2uS << " us)" << std::endl;
}